

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared.cpp
# Opt level: O1

bool extractLine(string *line,string *text,int width,bool hyphenate,uint *offset,char surrogate)

{
  char cVar1;
  char cVar2;
  ulong uVar3;
  pointer pcVar4;
  wchar_t ucs;
  int iVar5;
  ulong uVar6;
  long *plVar7;
  int iVar8;
  int iVar9;
  undefined7 in_register_00000009;
  size_type *psVar10;
  int iVar11;
  ulong uVar12;
  undefined3 in_register_00000089;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  size_type bytes;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  ulong local_60;
  undefined4 local_58;
  undefined4 local_54;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_54 = CONCAT31(in_register_00000089,surrogate);
  uVar6 = (ulong)*offset;
  uVar3 = text->_M_string_length;
  if (uVar3 <= uVar6) goto LAB_00114f55;
  local_58 = (undefined4)CONCAT71(in_register_00000009,hyphenate);
  uVar12 = 0;
  uVar15 = uVar6;
  iVar9 = 0;
  local_60 = uVar6;
  do {
    do {
      iVar8 = iVar9;
      uVar14 = uVar15;
      uVar15 = local_60;
      ucs = utf8_next_char(text,&local_60);
      if (ucs == L' ') {
        uVar12 = uVar15 & 0xffffffff;
      }
      else if ((ucs == L'\n') || (ucs == L'\0')) {
        std::__cxx11::string::substr((ulong)&local_80,(ulong)text);
        std::__cxx11::string::operator=((string *)line,(string *)&local_80);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        uVar15 = local_60 & 0xffffffff;
        goto LAB_00114f48;
      }
      iVar5 = mk_wcwidth(ucs);
      iVar9 = iVar5 + iVar8;
    } while (iVar9 <= width);
    pcVar4 = (text->_M_dataplus)._M_p;
    cVar1 = pcVar4[uVar14];
    cVar2 = pcVar4[uVar15];
    if (cVar2 == ' ' && cVar1 != ' ') {
      std::__cxx11::string::substr((ulong)&local_80,(ulong)text);
      std::__cxx11::string::operator=((string *)line,(string *)&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      uVar15 = (ulong)((int)uVar15 + 1);
      goto LAB_00114f48;
    }
    iVar11 = (int)uVar12;
    if ((iVar11 != 0 && cVar2 != ' ') && cVar1 == ' ') {
      std::__cxx11::string::substr((ulong)&local_80,(ulong)text);
      std::__cxx11::string::operator=((string *)line,(string *)&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      goto LAB_00114f48;
    }
  } while (cVar1 == ' ' || cVar2 == ' ');
  if (iVar11 == 0) {
    if (uVar15 == *offset && width < iVar5) {
      std::__cxx11::string::_M_replace_aux((ulong)line,0,line->_M_string_length,'\x01');
      uVar15 = local_60 & 0xffffffff;
      goto LAB_00114f48;
    }
    if ((char)local_58 == '\0') {
LAB_00114f0c:
      std::__cxx11::string::substr((ulong)&local_80,(ulong)text);
      std::__cxx11::string::operator=((string *)line,(string *)&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      goto LAB_00114f48;
    }
    if (iVar8 < width) {
      std::__cxx11::string::substr((ulong)&local_50,(ulong)text);
      plVar7 = (long *)std::__cxx11::string::_M_replace_aux
                                 ((ulong)&local_50,local_50._M_string_length,0,'\x01');
      psVar10 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_80.field_2._M_allocated_capacity = *psVar10;
        local_80.field_2._8_8_ = plVar7[3];
        local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      }
      else {
        local_80.field_2._M_allocated_capacity = *psVar10;
        local_80._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_80._M_string_length = plVar7[1];
      *plVar7 = (long)psVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::__cxx11::string::operator=((string *)line,(string *)&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      if (uVar14 == *offset) goto LAB_00114f0c;
      std::__cxx11::string::substr((ulong)&local_50,(ulong)text);
      std::operator+(&local_80,&local_50,'-');
      std::__cxx11::string::operator=((string *)line,(string *)&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      uVar15 = uVar14 & 0xffffffff;
    }
    uVar13 = (uint)uVar15;
  }
  else {
    std::__cxx11::string::substr((ulong)&local_80,(ulong)text);
    std::__cxx11::string::operator=((string *)line,(string *)&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    uVar15 = (ulong)(iVar11 + 1);
LAB_00114f48:
    uVar13 = (uint)uVar15;
  }
  *offset = uVar13;
LAB_00114f55:
  return uVar6 < uVar3;
}

Assistant:

bool extractLine (
  std::string& line,
  const std::string& text,
  int width,
  bool hyphenate,
  unsigned int& offset,
  char surrogate)
{
  // Terminate processing.
  // Note: bytes vs bytes.
  if (offset >= text.length ())
    return false;

  std::string::size_type last_last_bytes = offset;
  std::string::size_type last_bytes = offset;
  std::string::size_type bytes = offset;
  unsigned int last_ws = 0;
  int character;
  int char_width = 0;
  int line_width = 0;
  while (1)
  {
    last_last_bytes = last_bytes;
    last_bytes = bytes;
    character = utf8_next_char (text, bytes);

    if (character == 0 ||
        character == '\n')
    {
      line = text.substr (offset, last_bytes - offset);
      offset = bytes;
      break;
    }
    else if (character == ' ')
      last_ws = last_bytes;

    char_width = mk_wcwidth (character);
    if (line_width + char_width > width)
    {
      int last_last_character = text[last_last_bytes];
      int last_character = text[last_bytes];

      // [case 1] one| two --> last_last != 32, last == 32, ws == 0
      if (last_last_character != ' ' &&
          last_character      == ' ')
      {
        line = text.substr (offset, last_bytes - offset);
        offset = last_bytes + 1;
        break;
      }

      // [case 2] one |two --> last_last == 32, last != 32, ws != 0
      else if (last_last_character == ' ' &&
               last_character      != ' ' &&
               last_ws             != 0)
      {
        line = text.substr (offset, last_bytes - offset - 1);
        offset = last_bytes;
        break;
      }

      else if (last_last_character != ' ' &&
               last_character      != ' ')
      {
        // [case 3] one t|wo --> last_last != 32, last != 32, ws != 0
        if (last_ws != 0)
        {
          line = text.substr (offset, last_ws - offset);
          offset = last_ws + 1;
          break;
        }
        // [case 4] on|e two --> last_last != 32, last != 32, ws == 0
        else
        {
          if (char_width > width && last_bytes == offset)
          {
            // the first character is already too wide,
            // no other way to split the line but to replace the character
            // with a surrogate
            line = surrogate;
            offset = bytes;
          }
          else
          {
            if (hyphenate)
            {
              if (line_width + 1 <= width)
              {
                // if the last good part + hyphen is short enough,
                // i.e. the just read character is wider than one column
                line = text.substr (offset, last_bytes - offset) + '-';
                offset = last_bytes;
              }
              else if (last_last_bytes - offset > 0)
              {
                // sacrifice last character from the last good part,
                // but only if there is at least one character left
                line = text.substr (offset, last_last_bytes - offset) + '-';
                offset = last_last_bytes;
              }
              else
              {
                // no other way to split the line but to omit the hyphen
                line = text.substr (offset, last_bytes - offset);
                offset = last_bytes;
              }
            }
            else
            {
              // just use the last good part
              line = text.substr (offset, last_bytes - offset);
              offset = last_bytes;
            }
          }
        }

        break;
      }
    }

    line_width += char_width;
  }

  return true;
}